

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::Chapters::~Chapters(Chapters *this)

{
  Chapter *pCVar1;
  uint uVar2;
  long lVar3;
  
  while( true ) {
    pCVar1 = this->chapters_;
    if (this->chapters_count_ < 1) break;
    uVar2 = this->chapters_count_ - 1;
    this->chapters_count_ = uVar2;
    Chapter::Clear(pCVar1 + uVar2);
  }
  if (pCVar1 != (Chapter *)0x0) {
    if (*(long *)&pCVar1[-1].displays_size_ != 0) {
      lVar3 = *(long *)&pCVar1[-1].displays_size_ * 0x30;
      do {
        Chapter::~Chapter((Chapter *)((long)&pCVar1[-1].id_ + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != 0);
    }
    operator_delete__(&pCVar1[-1].displays_size_);
  }
  this->chapters_ = (Chapter *)0x0;
  return;
}

Assistant:

Chapters::~Chapters() {
  while (chapters_count_ > 0) {
    Chapter& chapter = chapters_[--chapters_count_];
    chapter.Clear();
  }

  delete[] chapters_;
  chapters_ = NULL;
}